

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O3

void debug_print_oprom_version(igsc_oprom_type type,igsc_oprom_version *oprom_version)

{
  long lVar1;
  uint uVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  long in_FS_OFFSET;
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = igsc_get_log_level();
  if (uVar2 != 0) {
    p_Var3 = igsc_get_log_callback_func();
    if (p_Var3 == (igsc_log_func_t)0x0) {
      pcVar4 = gsc_time(__time_buf,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n",
             pcVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
             "debug_print_oprom_version",0x99,type,(ulong)oprom_version->version[0],
             (ulong)oprom_version->version[1],(ulong)oprom_version->version[2],
             (ulong)oprom_version->version[3],(ulong)oprom_version->version[4],
             (ulong)oprom_version->version[5],(ulong)oprom_version->version[6],
             (ulong)oprom_version->version[7]);
    }
    else {
      p_Var3 = igsc_get_log_callback_func();
      pcVar4 = gsc_time(__time_buf,0x80);
      (*p_Var3)(IGSC_LOG_LEVEL_DEBUG,
                "%s: IGSC: (%s:%s():%d) OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n"
                ,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
                "debug_print_oprom_version",0x99,type,(ulong)oprom_version->version[0],
                (ulong)oprom_version->version[1],(ulong)oprom_version->version[2],
                (ulong)oprom_version->version[3],(ulong)oprom_version->version[4],
                (ulong)oprom_version->version[5],(ulong)oprom_version->version[6],
                (ulong)oprom_version->version[7]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void debug_print_oprom_version(enum igsc_oprom_type type,
                                      const struct igsc_oprom_version *oprom_version)
{

    gsc_debug("OPROM %d Version: %02X %02X %02X %02X %02X %02X %02X %02X\n",
           type,
           oprom_version->version[0],
           oprom_version->version[1],
           oprom_version->version[2],
           oprom_version->version[3],
           oprom_version->version[4],
           oprom_version->version[5],
           oprom_version->version[6],
           oprom_version->version[7]);
}